

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v6::internal::vformat<char>
          (basic_string_view<char> format_str,
          basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          args)

{
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  iterator this;
  unsigned_long_long in_RDX;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  allocator<char> *in_stack_fffffffffffffd58;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_2
  in_stack_fffffffffffffda8;
  basic_string_view<char> in_stack_fffffffffffffdb0;
  
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdbf);
  args_00.field_1.args_ = in_stack_fffffffffffffda8.args_;
  args_00.types_ = in_RDX;
  this = vformat_to<char>((buffer<char> *)in_RSI,in_stack_fffffffffffffdb0,args_00);
  to_string<char,500ul>(in_RSI);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)this.container);
  return in_RDI;
}

Assistant:

inline std::basic_string<Char> internal::vformat(
    basic_string_view<Char> format_str,
    basic_format_args<buffer_context<Char>> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}